

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan.c
# Opt level: O1

int glfwGetPhysicalDevicePresentationSupport
              (VkInstance instance,VkPhysicalDevice device,uint32_t queuefamily)

{
  GLFWbool GVar1;
  int iVar2;
  char *format;
  
  if (instance == (VkInstance)0x0) {
    __assert_fail("instance != VK_NULL_HANDLE",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hporro[P]fragmentSand/libs/glfw-3.3/src/vulkan.c"
                  ,0x111,
                  "int glfwGetPhysicalDevicePresentationSupport(VkInstance, VkPhysicalDevice, uint32_t)"
                 );
  }
  if (device == (VkPhysicalDevice)0x0) {
    __assert_fail("device != VK_NULL_HANDLE",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hporro[P]fragmentSand/libs/glfw-3.3/src/vulkan.c"
                  ,0x112,
                  "int glfwGetPhysicalDevicePresentationSupport(VkInstance, VkPhysicalDevice, uint32_t)"
                 );
  }
  if (_glfw.initialized == 0) {
    iVar2 = 0x10001;
    format = (char *)0x0;
  }
  else {
    GVar1 = _glfwInitVulkan(2);
    if (GVar1 == 0) {
      return 0;
    }
    if (_glfw.vk.extensions[0] != (char *)0x0) {
      iVar2 = _glfwPlatformGetPhysicalDevicePresentationSupport(instance,device,queuefamily);
      return iVar2;
    }
    format = "Vulkan: Window surface creation extensions not found";
    iVar2 = 0x10006;
  }
  _glfwInputError(iVar2,format);
  return 0;
}

Assistant:

GLFWAPI int glfwGetPhysicalDevicePresentationSupport(VkInstance instance,
                                                     VkPhysicalDevice device,
                                                     uint32_t queuefamily)
{
    assert(instance != VK_NULL_HANDLE);
    assert(device != VK_NULL_HANDLE);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (!_glfwInitVulkan(_GLFW_REQUIRE_LOADER))
        return GLFW_FALSE;

    if (!_glfw.vk.extensions[0])
    {
        _glfwInputError(GLFW_API_UNAVAILABLE,
                        "Vulkan: Window surface creation extensions not found");
        return GLFW_FALSE;
    }

    return _glfwPlatformGetPhysicalDevicePresentationSupport(instance,
                                                             device,
                                                             queuefamily);
}